

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.h
# Opt level: O1

void __thiscall
llvm::line_iterator::line_iterator
          (line_iterator *this,MemoryBuffer *Buffer,bool SkipBlanks,char CommentMarker)

{
  MemoryBuffer *pMVar1;
  MemoryBuffer *pMVar2;
  MemoryBuffer *pMVar3;
  bool bVar4;
  
  pMVar1 = (MemoryBuffer *)Buffer->BufferStart;
  pMVar2 = (MemoryBuffer *)Buffer->BufferEnd;
  bVar4 = pMVar2 == pMVar1;
  if (bVar4) {
    Buffer = (MemoryBuffer *)0x0;
  }
  this->Buffer = Buffer;
  this->CommentMarker = CommentMarker;
  this->SkipBlanks = SkipBlanks;
  this->LineNumber = 1;
  pMVar3 = (MemoryBuffer *)0x0;
  if (!bVar4) {
    pMVar3 = pMVar1;
  }
  (this->CurrentLine).Data = (char *)pMVar3;
  (this->CurrentLine).Length = 0;
  if (!bVar4) {
    if (*(char *)&pMVar2->_vptr_MemoryBuffer != '\0') {
      __assert_fail("Buffer.getBufferEnd()[0] == \'\\0\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/LineIterator.cpp"
                    ,0x2b,"llvm::line_iterator::line_iterator(const MemoryBuffer &, bool, char)");
    }
    if ((SkipBlanks) ||
       ((*(char *)&pMVar1->_vptr_MemoryBuffer != '\n' &&
        ((*(char *)&pMVar1->_vptr_MemoryBuffer != '\r' ||
         (*(char *)((long)&pMVar1->_vptr_MemoryBuffer + 1) != '\n')))))) {
      advance(this);
      return;
    }
  }
  return;
}

Assistant:

size_t getBufferSize() const { return BufferEnd-BufferStart; }